

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_api.cc
# Opt level: O2

int XLearnHello(void)

{
  ostream *poVar1;
  Modifier reset;
  Modifier bold;
  Modifier def;
  Modifier green;
  string logo;
  Modifier local_40;
  Modifier local_3c;
  Modifier local_38;
  Modifier local_34;
  string local_30 [32];
  
  std::__cxx11::string::string
            (local_30,
             "----------------------------------------------------------------------------------------------\n           _\n          | |\n     __  _| |     ___  __ _ _ __ _ __\n     \\ \\/ / |    / _ \\/ _` | \'__| \'_ \\ \n      >  <| |___|  __/ (_| | |  | | | |\n     /_/\\_\\_____/\\___|\\__,_|_|  |_| |_|\n\n        xLearn   -- 0.44 Version --\n----------------------------------------------------------------------------------------------\n\n"
             ,(allocator *)&local_34);
  local_40.code = RESET;
  local_38.code = FG_DEFAULT;
  local_3c.code = BOLD;
  local_34.code = FG_GREEN;
  poVar1 = Color::operator<<((ostream *)&std::cout,&local_34);
  poVar1 = Color::operator<<(poVar1,&local_3c);
  poVar1 = std::operator<<(poVar1,local_30);
  poVar1 = Color::operator<<(poVar1,&local_38);
  Color::operator<<(poVar1,&local_40);
  std::__cxx11::string::~string(local_30);
  return 0;
}

Assistant:

XL_DLL int XLearnHello() {
  API_BEGIN();
  std::string logo = 
"----------------------------------------------------------------------------------------------\n"
                    "           _\n"
                    "          | |\n"
                    "     __  _| |     ___  __ _ _ __ _ __\n"
                    "     \\ \\/ / |    / _ \\/ _` | '__| '_ \\ \n"
                    "      >  <| |___|  __/ (_| | |  | | | |\n"
                    "     /_/\\_\\_____/\\___|\\__,_|_|  |_| |_|\n\n"
                    "        xLearn   -- 0.44 Version --\n"
"----------------------------------------------------------------------------------------------\n"
"\n";
  Color::Modifier green(Color::FG_GREEN);
  Color::Modifier def(Color::FG_DEFAULT);
  Color::Modifier bold(Color::BOLD);
  Color::Modifier reset(Color::RESET);
  std::cout << green << bold << logo << def << reset;
  API_END();
}